

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trainer.cpp
# Opt level: O2

double __thiscall
Trainer::Trainer<Kuhn::Game>::chanceSamplingCFR
          (Trainer<Kuhn::Game> *this,Game *game,int playerIndex,double pi,double po)

{
  long lVar1;
  bool bVar2;
  uint actionNum;
  int iVar3;
  result_type action;
  mapped_type *ppNVar4;
  mapped_type this_00;
  double *pdVar5;
  int a;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  double dStack_130;
  undefined1 local_128 [8];
  Game game_cp;
  discrete_distribution<int> dist;
  string infoSet;
  double local_38;
  
  this->mNodeTouchedCnt = this->mNodeTouchedCnt + 1;
  dStack_130 = 5.52834260348417e-318;
  bVar2 = Kuhn::Game::done(game);
  if (!bVar2) {
    dStack_130 = 5.52855505171188e-318;
    Kuhn::Game::infoSetStr_abi_cxx11_
              ((string *)
               &dist._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,game);
    dStack_130 = 5.52859457696355e-318;
    actionNum = Kuhn::Game::actionNum(game);
    dStack_130 = 5.52866868681043e-318;
    iVar3 = Kuhn::Game::currentPlayer(game);
    if (this->mUpdate[iVar3] == false) {
      dStack_130 = 5.53018546834316e-318;
      Kuhn::Game::Game((Game *)local_128,game);
      dStack_130 = 5.5302991034417e-318;
      ppNVar4 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      *)(this->mFixedStrategies + iVar3),
                     (key_type *)
                     &dist._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
      dStack_130 = 5.53033862869337e-318;
      pdVar5 = Node::averageStrategy(*ppNVar4);
      dStack_130 = 5.53044732313545e-318;
      std::discrete_distribution<int>::param_type::param_type<double_const*>
                ((param_type *)(game_cp.mInfoSets[1] + 9),pdVar5,pdVar5 + (int)actionNum);
      dStack_130 = 5.53052143298233e-318;
      action = std::discrete_distribution<int>::operator()
                         ((discrete_distribution<int> *)(game_cp.mInfoSets[1] + 9),&this->mEngine);
      dStack_130 = 5.53059060217275e-318;
      Kuhn::Game::step((Game *)local_128,action);
      dStack_130 = 5.53072399989712e-318;
      local_38 = chanceSamplingCFR(this,(Game *)local_128,playerIndex,pi,po);
      dStack_130 = 5.53080799105692e-318;
      std::discrete_distribution<int>::param_type::~param_type
                ((param_type *)(game_cp.mInfoSets[1] + 9));
    }
    else {
      dStack_130 = 5.52889595700751e-318;
      ppNVar4 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&this->mNodeMap,
                             (key_type *)
                             &dist._M_param._M_cp.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
      this_00 = *ppNVar4;
      if (this_00 == (mapped_type)0x0) {
        dStack_130 = 5.52897500751085e-318;
        this_00 = (mapped_type)operator_new(0x30);
        dStack_130 = 5.52904417670126e-318;
        Node::Node(this_00,actionNum);
        dStack_130 = 5.52911828654814e-318;
        ppNVar4 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&this->mNodeMap,
                               (key_type *)
                               &dist._M_param._M_cp.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage);
        *ppNVar4 = this_00;
      }
      dStack_130 = 5.52921215902085e-318;
      pdVar5 = Node::strategy(this_00);
      lVar1 = -((ulong)actionNum * 8 + 0xf & 0xfffffffffffffff0);
      uVar7 = 0;
      uVar6 = (ulong)actionNum;
      if ((int)actionNum < 1) {
        uVar6 = uVar7;
      }
      local_38 = 0.0;
      for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
        *(undefined8 *)(local_128 + lVar1 + -8) = 0x1113e7;
        Kuhn::Game::Game((Game *)local_128,game);
        *(undefined8 *)(local_128 + lVar1 + -8) = 0x1113f2;
        Kuhn::Game::step((Game *)local_128,(int)uVar7);
        if (iVar3 == playerIndex) {
          dVar8 = pdVar5[uVar7] * pi;
          dVar9 = po;
        }
        else {
          dVar8 = pi;
          dVar9 = pdVar5[uVar7] * po;
        }
        *(undefined8 *)(local_128 + lVar1 + -8) = 0x111426;
        dVar8 = chanceSamplingCFR(this,(Game *)local_128,playerIndex,dVar8,dVar9);
        *(double *)(local_128 + uVar7 * 8 + lVar1 + -0x128 + 0x128) = dVar8;
        local_38 = local_38 + dVar8 * pdVar5[uVar7];
      }
      if (iVar3 == playerIndex) {
        for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
          dVar8 = *(double *)(local_128 + uVar7 * 8 + lVar1 + -0x128 + 0x128);
          *(undefined8 *)(local_128 + lVar1 + -8) = 0x111502;
          dVar9 = Node::regretSum(this_00,(int)uVar7);
          *(undefined8 *)(local_128 + lVar1 + -8) = 0x111523;
          Node::regretSum(this_00,(int)uVar7,(dVar8 - local_38) * po + dVar9);
        }
        *(undefined8 *)(local_128 + lVar1 + -8) = 0x111539;
        Node::strategySum(this_00,pdVar5,pi);
      }
    }
    dStack_130 = 5.53136628523672e-318;
    std::__cxx11::string::~string
              ((string *)
               &dist._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    return local_38;
  }
  dVar8 = Kuhn::Game::payoff(game,playerIndex);
  return dVar8;
}

Assistant:

double Trainer<T>::chanceSamplingCFR(const T &game, const int playerIndex, const double pi, const double po) {
    ++mNodeTouchedCnt;

    // return payoff for terminal states
    if (game.done()) {
        return game.payoff(playerIndex);
    }

    // get information set string representation
    std::string infoSet = game.infoSetStr();

    // treat static player as chance node
    const int actionNum = game.actionNum();
    const int player = game.currentPlayer();
    if (!mUpdate[player]) {
        auto game_cp(game);
        auto strategy = mFixedStrategies[player].at(infoSet)->averageStrategy();
        std::discrete_distribution<int> dist(strategy, strategy + actionNum);
        game_cp.step(dist(mEngine));
        return chanceSamplingCFR(game_cp, playerIndex, pi, po);
    }

    // get information set node or create it if nonexistant
    Node *node = mNodeMap[infoSet];
    if (node == nullptr) {
        node = new Node(actionNum);
        mNodeMap[infoSet] = node;
    }

    // get current strategy through regret-matching
    const double *strategy = node->strategy();

    // for each action, recursively call cfr with additional history and probability
    double utils[actionNum];
    double nodeUtil = 0;
    for (int a = 0; a < actionNum; ++a) {
        auto game_cp(game);
        game_cp.step(a);
        if (player == playerIndex) {
            utils[a] = chanceSamplingCFR(game_cp, playerIndex, pi * strategy[a], po);
        } else {
            utils[a] = chanceSamplingCFR(game_cp, playerIndex, pi, po * strategy[a]);
        }
        nodeUtil += strategy[a] * utils[a];
    }

    if (player == playerIndex) {
        // for each action, compute and accumulate counterfactual regret
        for (int a = 0; a < actionNum; ++a) {
            const double regret = utils[a] - nodeUtil;
            const double regretSum = node->regretSum(a) + po * regret;
            node->regretSum(a, regretSum);
        }
        // update average strategy across all training iterations
        node->strategySum(strategy, pi);
    }

    return nodeUtil;
}